

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

lys_restr * lys_restr_dup(lys_module *mod,lys_restr *old,int size,int shallow,unres_schema *unres)

{
  int iVar1;
  char *pcVar2;
  int local_3c;
  int i;
  lys_restr *result;
  unres_schema *unres_local;
  int shallow_local;
  int size_local;
  lys_restr *old_local;
  lys_module *mod_local;
  
  if (size == 0) {
    mod_local = (lys_module *)0x0;
  }
  else {
    mod_local = (lys_module *)calloc((long)size,0x38);
    if (mod_local == (lys_module *)0x0) {
      ly_log(mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_restr_dup");
      mod_local = (lys_module *)0x0;
    }
    else {
      for (local_3c = 0; local_3c < size; local_3c = local_3c + 1) {
        iVar1 = unres_schema_find(unres,-1,&old[local_3c].ext,UNRES_EXT);
        if (iVar1 == -1) {
          mod_local->padding2[(long)local_3c * 0x38 + -0x12] = old[local_3c].ext_size;
          lys_ext_dup(mod->ctx,mod,old[local_3c].ext,old[local_3c].ext_size,
                      mod_local->padding2 + (long)local_3c * 0x38 + -0x42,LYEXT_PAR_RESTR,
                      (lys_ext_instance ***)(mod_local->padding2 + (long)local_3c * 0x38 + -0x1a),
                      shallow,unres);
        }
        pcVar2 = lydict_insert(mod->ctx,old[local_3c].expr,0);
        *(char **)(mod_local->padding2 + (long)local_3c * 0x38 + -0x42) = pcVar2;
        pcVar2 = lydict_insert(mod->ctx,old[local_3c].dsc,0);
        *(char **)(mod_local->padding2 + (long)local_3c * 0x38 + -0x3a) = pcVar2;
        pcVar2 = lydict_insert(mod->ctx,old[local_3c].ref,0);
        *(char **)(mod_local->padding2 + (long)local_3c * 0x38 + -0x32) = pcVar2;
        pcVar2 = lydict_insert(mod->ctx,old[local_3c].eapptag,0);
        *(char **)(mod_local->padding2 + (long)local_3c * 0x38 + -0x2a) = pcVar2;
        pcVar2 = lydict_insert(mod->ctx,old[local_3c].emsg,0);
        *(char **)(mod_local->padding2 + (long)local_3c * 0x38 + -0x22) = pcVar2;
      }
    }
  }
  return (lys_restr *)mod_local;
}

Assistant:

static struct lys_restr *
lys_restr_dup(struct lys_module *mod, struct lys_restr *old, int size, int shallow, struct unres_schema *unres)
{
    struct lys_restr *result;
    int i;

    if (!size) {
        return NULL;
    }

    result = calloc(size, sizeof *result);
    LY_CHECK_ERR_RETURN(!result, LOGMEM(mod->ctx), NULL);

    for (i = 0; i < size; i++) {
        /* copying unresolved extensions is not supported */
        if (unres_schema_find(unres, -1, (void *)&old[i].ext, UNRES_EXT) == -1) {
            result[i].ext_size = old[i].ext_size;
            lys_ext_dup(mod->ctx, mod, old[i].ext, old[i].ext_size, &result[i], LYEXT_PAR_RESTR, &result[i].ext, shallow, unres);
        }
        result[i].expr = lydict_insert(mod->ctx, old[i].expr, 0);
        result[i].dsc = lydict_insert(mod->ctx, old[i].dsc, 0);
        result[i].ref = lydict_insert(mod->ctx, old[i].ref, 0);
        result[i].eapptag = lydict_insert(mod->ctx, old[i].eapptag, 0);
        result[i].emsg = lydict_insert(mod->ctx, old[i].emsg, 0);
    }

    return result;
}